

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O1

optional_ptr<duckdb::PersistentCollectionData,_true> __thiscall
duckdb::SingleFileStorageCommitState::GetRowGroupData
          (SingleFileStorageCommitState *this,DataTable *table,idx_t start_index,idx_t *count)

{
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  key_type local_20;
  
  p_Var3 = (_Hash_node_base *)0x0;
  local_20._M_data = table;
  p_Var2 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::DataTable>,_std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::DataTable>,_std::unordered_map<unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::OptimisticallyWrittenRowGroupData>_>_>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::DataTable>,_duckdb::ReferenceHashFunction<duckdb::DataTable>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->optimistically_written_data)._M_h,
                      (ulong)table % (this->optimistically_written_data)._M_h._M_bucket_count,
                      &local_20,(__hash_code)table);
  if (p_Var2 != (__node_base_ptr)0x0) {
    p_Var3 = p_Var2->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    uVar4 = start_index % (ulong)p_Var3[3]._M_nxt;
    p_Var5 = p_Var3[2]._M_nxt[uVar4]._M_nxt;
    p_Var6 = (_Hash_node_base *)0x0;
    if ((p_Var5 != (_Hash_node_base *)0x0) &&
       (p_Var1 = p_Var5->_M_nxt, p_Var6 = p_Var5,
       p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)start_index)) {
      while (p_Var5 = p_Var1, p_Var1 = p_Var5->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var6 = (_Hash_node_base *)0x0;
        if (((ulong)p_Var1[1]._M_nxt % (ulong)p_Var3[3]._M_nxt != uVar4) ||
           (p_Var6 = p_Var5, p_Var1[1]._M_nxt == (_Hash_node_base *)start_index)) goto LAB_01142bbb;
      }
      p_Var6 = (_Hash_node_base *)0x0;
    }
LAB_01142bbb:
    if (p_Var6 == (_Hash_node_base *)0x0) {
      p_Var3 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var3 = p_Var6->_M_nxt;
    }
    if (p_Var3 != (_Hash_node_base *)0x0) {
      *count = (idx_t)p_Var3[3]._M_nxt;
      return (optional_ptr<duckdb::PersistentCollectionData,_true>)
             (PersistentCollectionData *)p_Var3[4]._M_nxt;
    }
  }
  return (optional_ptr<duckdb::PersistentCollectionData,_true>)(PersistentCollectionData *)0x0;
}

Assistant:

optional_ptr<PersistentCollectionData> SingleFileStorageCommitState::GetRowGroupData(DataTable &table,
                                                                                     idx_t start_index, idx_t &count) {
	auto entry = optimistically_written_data.find(table);
	if (entry == optimistically_written_data.end()) {
		// no data for this table
		return nullptr;
	}
	auto &row_groups = entry->second;
	auto start_entry = row_groups.find(start_index);
	if (start_entry == row_groups.end()) {
		// this row group was not optimistically written
		return nullptr;
	}
	count = start_entry->second.count;
	return start_entry->second.row_group_data.get();
}